

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

int ftp_file_open(char *url,int rwmode,int *handle)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ssize_t sVar4;
  uint uVar5;
  FILE *pFVar6;
  int *status_00;
  int status;
  int sock;
  FILE *command;
  FILE *ftpfile;
  char errorstr [1200];
  int local_500;
  int local_4fc;
  FILE *local_4f8;
  FILE *local_4f0;
  char local_4e8 [1208];
  
  if (netoutfile._0_4_ == 0x3a6d656d) {
    iVar1 = ftp_open(url,0,handle);
    return iVar1;
  }
  closeftpfile = 0;
  closecommandfile = 0;
  closefile = 0;
  closeoutfile = 0;
  sVar2 = strlen(netoutfile);
  uVar5 = (uint)sVar2;
  if (uVar5 == 0) {
    ffpmsg("Output file not set, shouldn\'t have happened (ftp_file_open)");
    return 0x68;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)env);
  if (iVar1 != 0) {
    ffpmsg("Timeout (ftp_file_open)");
    snprintf(local_4e8,0x4b0,"Download timeout exceeded: %d seconds",(ulong)net_timeout);
    ffpmsg(local_4e8);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    url = "   Timeout may be adjusted with fits_set_timeout";
    goto LAB_00136d85;
  }
  signal(0xe,signal_handler);
  alarm(net_timeout);
  local_500 = ftp_open_network(url,(FILE **)&local_4f0,(FILE **)&local_4f8,&local_4fc);
  if (local_500 != 0) {
    alarm(0);
    ffpmsg("Unable to open http file (ftp_file_open)");
    goto LAB_00136d85;
  }
  closeftpfile = closeftpfile + 1;
  closecommandfile = closecommandfile + 1;
  iVar1 = 0;
  if (netoutfile[0] == '!') {
    if (0 < (int)uVar5) {
      memmove(netoutfile,netoutfile + 1,(ulong)(uVar5 & 0x7fffffff));
    }
    iVar1 = file_remove(netoutfile);
  }
  local_500 = iVar1;
  __stream = local_4f0;
  uVar5 = fgetc(local_4f0);
  ungetc((int)(char)uVar5,__stream);
  pcVar3 = strstr(url,".gz");
  if (((pcVar3 == (char *)0x0) && (pcVar3 = strstr(url,".Z"), (uVar5 & 0xff) != 0x1f)) &&
     (pcVar3 == (char *)0x0)) {
    local_500 = file_create(netoutfile,handle);
    if (local_500 == 0) {
      closefile = closefile + 1;
      alarm(net_timeout);
      pFVar6 = __stream;
      sVar2 = fread(local_4e8,1,0x4b0,__stream);
      iVar1 = (int)pFVar6;
      if (sVar2 != 0) {
        do {
          alarm(0);
          local_500 = file_write(*handle,local_4e8,sVar2);
          if (local_500 != 0) {
            pcVar3 = "Error writing file (ftp_file_open)";
            goto LAB_00136f8c;
          }
          alarm(net_timeout);
          pFVar6 = __stream;
          sVar2 = fread(local_4e8,1,0x4b0,__stream);
          iVar1 = (int)pFVar6;
        } while (sVar2 != 0);
      }
      file_close(*handle);
LAB_00136fb7:
      fclose(__stream);
      closeftpfile = closeftpfile + -1;
      fclose(local_4f8);
      NET_SendRaw(local_4fc,"QUIT\r\n",6,iVar1);
      closecommandfile = closecommandfile + -1;
      signal(0xe,(__sighandler_t)0x0);
      alarm(0);
      iVar1 = file_open(netoutfile,rwmode,handle);
      return iVar1;
    }
LAB_00136d72:
    url = "Unable to create output file (ftp_file_open)";
  }
  else {
    local_500 = file_create(netoutfile,handle);
    if (local_500 != 0) goto LAB_00136d72;
    file_close(*handle);
    outfile = (FILE *)fopen(netoutfile,"w");
    if ((FILE *)outfile == (FILE *)0x0) {
      url = "Unable to reopen the output file (ftp_file_open)";
    }
    else {
      closeoutfile = closeoutfile + 1;
      status_00 = &local_500;
      local_500 = 0;
      alarm(net_timeout * 10);
      local_500 = uncompress2file(url,(FILE *)__stream,outfile,status_00);
      iVar1 = (int)status_00;
      alarm(0);
      if (local_500 == 0) {
        fclose((FILE *)outfile);
        closeoutfile = closeoutfile + -1;
        goto LAB_00136fb7;
      }
      pcVar3 = "Unable to uncompress the output file (ftp_file_open)";
LAB_00136f8c:
      ffpmsg(pcVar3);
    }
  }
  ffpmsg(url);
  url = netoutfile;
LAB_00136d85:
  ffpmsg(url);
  alarm(0);
  if (closeftpfile != 0) {
    fclose(local_4f0);
  }
  if ((closecommandfile != 0) && (fclose(local_4f8), -1 < local_4fc)) {
    uVar5 = 0;
    do {
      sVar4 = send(local_4fc,"QUIT\r\n" + uVar5,(long)(int)(6 - uVar5),0);
      if ((int)sVar4 < 1) break;
      uVar5 = uVar5 + (int)sVar4;
    } while ((int)uVar5 < 6);
  }
  if (closeoutfile != 0) {
    fclose((FILE *)outfile);
  }
  if (closefile != 0) {
    file_close(*handle);
  }
  signal(0xe,(__sighandler_t)0x0);
  return 0x68;
}

Assistant:

int ftp_file_open(char *url, int rwmode, int *handle)
{
  FILE *ftpfile;
  FILE *command;
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int sock;
  int ii, flen, status;
  char firstchar;

  /* Check if output file is actually a memory file */
  if (!strncmp(netoutfile, "mem:", 4) )
  {
     /* allow the memory file to be opened with write access */
     return( ftp_open(url, READONLY, handle) );
  }     

  closeftpfile = 0;
  closecommandfile = 0;
  closefile = 0;
  closeoutfile = 0;
  
  /* cfileio made a mistake, need to know where to write the output file */
  flen = strlen(netoutfile);
  if (!flen) 
    {
      ffpmsg("Output file not set, shouldn't have happened (ftp_file_open)");
      return (FILE_NOT_OPENED);
    }

  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (ftp_file_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }

  signal(SIGALRM, signal_handler);
  
  /* open the network connection to url. ftpfile holds the connection to
     the input file, command holds the connection to port 21, and sock is 
     the socket connected to port 21 */

  alarm(net_timeout);
  if ((status = ftp_open_network(url,&ftpfile,&command,&sock))) {
    alarm(0);
    ffpmsg("Unable to open http file (ftp_file_open)");
    ffpmsg(url);
    goto error;
  }
  closeftpfile++;
  closecommandfile++;

  if (*netoutfile == '!')
  {
     /* user wants to clobber file, if it already exists */
     for (ii = 0; ii < flen; ii++)
         netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

     status = file_remove(netoutfile);
  }

  /* Now, what do we do with the file */
  firstchar = fgetc(ftpfile);
  ungetc(firstchar,ftpfile);

  if (strstr(url,".gz") || 
      strstr(url,".Z") ||
      ('\037' == firstchar)) {

    /* to make this more cfitsioish we use the file driver calls to create
       the file */
    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (ftp_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }

    file_close(*handle);
    if (NULL == (outfile = fopen(netoutfile,"w"))) {
      ffpmsg("Unable to reopen the output file (ftp_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closeoutfile++;
    status = 0;

    /* Ok, this is a tough case, let's be arbritary and say 10*net_timeout,
       Given the choices for nettimeout above they'll probaby ^C before, but
       it's always worth a shot*/

    alarm(net_timeout*10);
    status = uncompress2file(url,ftpfile,outfile,&status);
    alarm(0);
    if (status) {
      ffpmsg("Unable to uncompress the output file (ftp_file_open)");
      ffpmsg(url);
      ffpmsg(netoutfile);
      goto error;
    }
    fclose(outfile);
    closeoutfile--;

  } else {
    
    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (ftp_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closefile++;
    
    /* write a file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,ftpfile))) {
      alarm(0);
      status = file_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error writing file (ftp_file_open)");
        ffpmsg(url);
        ffpmsg(netoutfile);
	goto error;
      }
      alarm(net_timeout);
    }
    file_close(*handle);
  }
  fclose(ftpfile);
  closeftpfile--;
  
  fclose(command);
  NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  closecommandfile--;

  signal(SIGALRM, SIG_DFL);
  alarm(0);

  return file_open(netoutfile,rwmode,handle);

 error:
  alarm(0); /* clear it */
  if (closeftpfile) {
    fclose(ftpfile);
  }
  if (closecommandfile) {
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  }
  if (closeoutfile) {
    fclose(outfile);
  }
  if (closefile) {
    file_close(*handle);
  } 
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}